

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-caster.h
# Opt level: O0

Matrix<double,__1,_1,_0,__1,_1> __thiscall
dynamicgraph::signal_io_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cast
          (signal_io_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this,istringstream *is)

{
  byte bVar1;
  ExceptionSignal *this_00;
  Index extraout_RDX;
  Matrix<double,__1,_1,_0,__1,_1> MVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  ErrorCodeEnum local_30 [5];
  undefined1 local_19;
  istringstream *local_18;
  istringstream *is_local;
  Matrix<double,__1,_1,_0,__1,_1> *inst;
  
  local_19 = 0;
  local_18 = is;
  is_local = (istringstream *)this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this);
  Eigen::operator>>(local_18,(Vector *)this);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_30[0] = GENERIC;
    std::__cxx11::istringstream::str();
    std::operator+(&local_50,"failed to serialize ",&local_70);
    dynamicgraph::ExceptionSignal::ExceptionSignal(this_00,local_30,(string *)&local_50);
    __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionSignal::~ExceptionSignal);
  }
  MVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  MVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Matrix<double,__1,_1,_0,__1,_1>)
         MVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

inline static T cast(std::istringstream &is) {
    T inst;
    is >> inst;
    if (is.fail()) {
      throw ExceptionSignal(ExceptionSignal::GENERIC,
                            "failed to serialize " + is.str());
    }
    return inst;
  }